

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O3

void base64_stream_encode_ssse3
               (base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  undefined1 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t sVar9;
  uint8_t *puVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  byte bVar13;
  uint uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  uVar14 = state->bytes;
  sVar9 = 0;
  bVar13 = state->carry;
  if ((ulong)uVar14 == 2) goto LAB_00103dcf;
  if (uVar14 == 1) goto LAB_00103d95;
  uVar11 = (ulong)uVar14;
  if (uVar14 == 0) {
    do {
      sVar9 = uVar11;
      auVar8 = _DAT_0010cff0;
      auVar7 = _DAT_0010cfd0;
      auVar6 = _DAT_0010cfb0;
      auVar5 = _DAT_0010cfa0;
      auVar4 = _DAT_0010cf90;
      auVar3 = _DAT_0010cf80;
      if (0xf < srclen) {
        uVar11 = (srclen - 4) / 0xc;
        srclen = srclen + uVar11 * -0xc;
        sVar9 = uVar11 * 0x10 + sVar9;
        puVar10 = (uint8_t *)out;
        pauVar12 = (undefined1 (*) [16])src;
        do {
          if (uVar11 < 8) {
            lVar15 = -4;
            if (3 < uVar11) goto LAB_00103b67;
            src = *pauVar12 + 0xc;
            out = (char *)(puVar10 + 0x10);
            auVar16 = pshufb(*pauVar12,auVar3);
            auVar33 = pmulhuw(auVar16 & auVar4,auVar5);
            auVar16 = auVar16 & auVar6;
            auVar25._0_2_ = auVar16._0_2_ * 0x10;
            auVar25._2_2_ = auVar16._2_2_ * 0x100;
            auVar25._4_2_ = auVar16._4_2_ * 0x10;
            auVar25._6_2_ = auVar16._6_2_ * 0x100;
            auVar25._8_2_ = auVar16._8_2_ * 0x10;
            auVar25._10_2_ = auVar16._10_2_ * 0x100;
            auVar25._12_2_ = auVar16._12_2_ * 0x10;
            auVar25._14_2_ = auVar16._14_2_ * 0x100;
            auVar25 = auVar25 | auVar33;
            auVar16 = psubusb(auVar25,auVar7);
            auVar33[0] = auVar16[0] + ('\x19' < auVar25[0]);
            auVar33[1] = auVar16[1] + ('\x19' < auVar25[1]);
            auVar33[2] = auVar16[2] + ('\x19' < auVar25[2]);
            auVar33[3] = auVar16[3] + ('\x19' < auVar25[3]);
            auVar33[4] = auVar16[4] + ('\x19' < auVar25[4]);
            auVar33[5] = auVar16[5] + ('\x19' < auVar25[5]);
            auVar33[6] = auVar16[6] + ('\x19' < auVar25[6]);
            auVar33[7] = auVar16[7] + ('\x19' < auVar25[7]);
            auVar33[8] = auVar16[8] + ('\x19' < auVar25[8]);
            auVar33[9] = auVar16[9] + ('\x19' < auVar25[9]);
            auVar33[10] = auVar16[10] + ('\x19' < auVar25[10]);
            auVar33[0xb] = auVar16[0xb] + ('\x19' < auVar25[0xb]);
            auVar33[0xc] = auVar16[0xc] + ('\x19' < auVar25[0xc]);
            auVar33[0xd] = auVar16[0xd] + ('\x19' < auVar25[0xd]);
            auVar33[0xe] = auVar16[0xe] + ('\x19' < auVar25[0xe]);
            auVar33[0xf] = auVar16[0xf] + ('\x19' < auVar25[0xf]);
            auVar16 = pshufb(auVar8,auVar33);
            *puVar10 = auVar16[0] + auVar25[0];
            puVar10[1] = auVar16[1] + auVar25[1];
            puVar10[2] = auVar16[2] + auVar25[2];
            puVar10[3] = auVar16[3] + auVar25[3];
            puVar10[4] = auVar16[4] + auVar25[4];
            puVar10[5] = auVar16[5] + auVar25[5];
            puVar10[6] = auVar16[6] + auVar25[6];
            puVar10[7] = auVar16[7] + auVar25[7];
            puVar10[8] = auVar16[8] + auVar25[8];
            puVar10[9] = auVar16[9] + auVar25[9];
            puVar10[10] = auVar16[10] + auVar25[10];
            puVar10[0xb] = auVar16[0xb] + auVar25[0xb];
            puVar10[0xc] = auVar16[0xc] + auVar25[0xc];
            puVar10[0xd] = auVar16[0xd] + auVar25[0xd];
            puVar10[0xe] = auVar16[0xe] + auVar25[0xe];
            puVar10[0xf] = auVar16[0xf] + auVar25[0xf];
            lVar15 = -2;
            if (uVar11 < 2) break;
          }
          else {
            auVar16 = pshufb(*pauVar12,auVar3);
            auVar25 = pmulhuw(auVar16 & auVar4,auVar5);
            auVar16 = auVar16 & auVar6;
            auVar17._0_2_ = auVar16._0_2_ * 0x10;
            auVar17._2_2_ = auVar16._2_2_ * 0x100;
            auVar17._4_2_ = auVar16._4_2_ * 0x10;
            auVar17._6_2_ = auVar16._6_2_ * 0x100;
            auVar17._8_2_ = auVar16._8_2_ * 0x10;
            auVar17._10_2_ = auVar16._10_2_ * 0x100;
            auVar17._12_2_ = auVar16._12_2_ * 0x10;
            auVar17._14_2_ = auVar16._14_2_ * 0x100;
            auVar17 = auVar17 | auVar25;
            auVar16 = psubusb(auVar17,auVar7);
            auVar26[0] = auVar16[0] + ('\x19' < auVar17[0]);
            auVar26[1] = auVar16[1] + ('\x19' < auVar17[1]);
            auVar26[2] = auVar16[2] + ('\x19' < auVar17[2]);
            auVar26[3] = auVar16[3] + ('\x19' < auVar17[3]);
            auVar26[4] = auVar16[4] + ('\x19' < auVar17[4]);
            auVar26[5] = auVar16[5] + ('\x19' < auVar17[5]);
            auVar26[6] = auVar16[6] + ('\x19' < auVar17[6]);
            auVar26[7] = auVar16[7] + ('\x19' < auVar17[7]);
            auVar26[8] = auVar16[8] + ('\x19' < auVar17[8]);
            auVar26[9] = auVar16[9] + ('\x19' < auVar17[9]);
            auVar26[10] = auVar16[10] + ('\x19' < auVar17[10]);
            auVar26[0xb] = auVar16[0xb] + ('\x19' < auVar17[0xb]);
            auVar26[0xc] = auVar16[0xc] + ('\x19' < auVar17[0xc]);
            auVar26[0xd] = auVar16[0xd] + ('\x19' < auVar17[0xd]);
            auVar26[0xe] = auVar16[0xe] + ('\x19' < auVar17[0xe]);
            auVar26[0xf] = auVar16[0xf] + ('\x19' < auVar17[0xf]);
            auVar16 = pshufb(auVar8,auVar26);
            *puVar10 = auVar16[0] + auVar17[0];
            puVar10[1] = auVar16[1] + auVar17[1];
            puVar10[2] = auVar16[2] + auVar17[2];
            puVar10[3] = auVar16[3] + auVar17[3];
            puVar10[4] = auVar16[4] + auVar17[4];
            puVar10[5] = auVar16[5] + auVar17[5];
            puVar10[6] = auVar16[6] + auVar17[6];
            puVar10[7] = auVar16[7] + auVar17[7];
            puVar10[8] = auVar16[8] + auVar17[8];
            puVar10[9] = auVar16[9] + auVar17[9];
            puVar10[10] = auVar16[10] + auVar17[10];
            puVar10[0xb] = auVar16[0xb] + auVar17[0xb];
            puVar10[0xc] = auVar16[0xc] + auVar17[0xc];
            puVar10[0xd] = auVar16[0xd] + auVar17[0xd];
            puVar10[0xe] = auVar16[0xe] + auVar17[0xe];
            puVar10[0xf] = auVar16[0xf] + auVar17[0xf];
            auVar16 = pshufb(*(undefined1 (*) [16])(*pauVar12 + 0xc),auVar3);
            auVar25 = pmulhuw(auVar16 & auVar4,auVar5);
            auVar16 = auVar16 & auVar6;
            auVar18._0_2_ = auVar16._0_2_ * 0x10;
            auVar18._2_2_ = auVar16._2_2_ * 0x100;
            auVar18._4_2_ = auVar16._4_2_ * 0x10;
            auVar18._6_2_ = auVar16._6_2_ * 0x100;
            auVar18._8_2_ = auVar16._8_2_ * 0x10;
            auVar18._10_2_ = auVar16._10_2_ * 0x100;
            auVar18._12_2_ = auVar16._12_2_ * 0x10;
            auVar18._14_2_ = auVar16._14_2_ * 0x100;
            auVar18 = auVar18 | auVar25;
            auVar16 = psubusb(auVar18,auVar7);
            auVar27[0] = auVar16[0] + ('\x19' < auVar18[0]);
            auVar27[1] = auVar16[1] + ('\x19' < auVar18[1]);
            auVar27[2] = auVar16[2] + ('\x19' < auVar18[2]);
            auVar27[3] = auVar16[3] + ('\x19' < auVar18[3]);
            auVar27[4] = auVar16[4] + ('\x19' < auVar18[4]);
            auVar27[5] = auVar16[5] + ('\x19' < auVar18[5]);
            auVar27[6] = auVar16[6] + ('\x19' < auVar18[6]);
            auVar27[7] = auVar16[7] + ('\x19' < auVar18[7]);
            auVar27[8] = auVar16[8] + ('\x19' < auVar18[8]);
            auVar27[9] = auVar16[9] + ('\x19' < auVar18[9]);
            auVar27[10] = auVar16[10] + ('\x19' < auVar18[10]);
            auVar27[0xb] = auVar16[0xb] + ('\x19' < auVar18[0xb]);
            auVar27[0xc] = auVar16[0xc] + ('\x19' < auVar18[0xc]);
            auVar27[0xd] = auVar16[0xd] + ('\x19' < auVar18[0xd]);
            auVar27[0xe] = auVar16[0xe] + ('\x19' < auVar18[0xe]);
            auVar27[0xf] = auVar16[0xf] + ('\x19' < auVar18[0xf]);
            auVar16 = pshufb(auVar8,auVar27);
            puVar10[0x10] = auVar16[0] + auVar18[0];
            puVar10[0x11] = auVar16[1] + auVar18[1];
            puVar10[0x12] = auVar16[2] + auVar18[2];
            puVar10[0x13] = auVar16[3] + auVar18[3];
            puVar10[0x14] = auVar16[4] + auVar18[4];
            puVar10[0x15] = auVar16[5] + auVar18[5];
            puVar10[0x16] = auVar16[6] + auVar18[6];
            puVar10[0x17] = auVar16[7] + auVar18[7];
            puVar10[0x18] = auVar16[8] + auVar18[8];
            puVar10[0x19] = auVar16[9] + auVar18[9];
            puVar10[0x1a] = auVar16[10] + auVar18[10];
            puVar10[0x1b] = auVar16[0xb] + auVar18[0xb];
            puVar10[0x1c] = auVar16[0xc] + auVar18[0xc];
            puVar10[0x1d] = auVar16[0xd] + auVar18[0xd];
            puVar10[0x1e] = auVar16[0xe] + auVar18[0xe];
            puVar10[0x1f] = auVar16[0xf] + auVar18[0xf];
            auVar16 = pshufb(*(undefined1 (*) [16])(pauVar12[1] + 8),auVar3);
            auVar25 = pmulhuw(auVar16 & auVar4,auVar5);
            auVar16 = auVar16 & auVar6;
            auVar19._0_2_ = auVar16._0_2_ * 0x10;
            auVar19._2_2_ = auVar16._2_2_ * 0x100;
            auVar19._4_2_ = auVar16._4_2_ * 0x10;
            auVar19._6_2_ = auVar16._6_2_ * 0x100;
            auVar19._8_2_ = auVar16._8_2_ * 0x10;
            auVar19._10_2_ = auVar16._10_2_ * 0x100;
            auVar19._12_2_ = auVar16._12_2_ * 0x10;
            auVar19._14_2_ = auVar16._14_2_ * 0x100;
            auVar19 = auVar19 | auVar25;
            auVar16 = psubusb(auVar19,auVar7);
            auVar28[0] = auVar16[0] + ('\x19' < auVar19[0]);
            auVar28[1] = auVar16[1] + ('\x19' < auVar19[1]);
            auVar28[2] = auVar16[2] + ('\x19' < auVar19[2]);
            auVar28[3] = auVar16[3] + ('\x19' < auVar19[3]);
            auVar28[4] = auVar16[4] + ('\x19' < auVar19[4]);
            auVar28[5] = auVar16[5] + ('\x19' < auVar19[5]);
            auVar28[6] = auVar16[6] + ('\x19' < auVar19[6]);
            auVar28[7] = auVar16[7] + ('\x19' < auVar19[7]);
            auVar28[8] = auVar16[8] + ('\x19' < auVar19[8]);
            auVar28[9] = auVar16[9] + ('\x19' < auVar19[9]);
            auVar28[10] = auVar16[10] + ('\x19' < auVar19[10]);
            auVar28[0xb] = auVar16[0xb] + ('\x19' < auVar19[0xb]);
            auVar28[0xc] = auVar16[0xc] + ('\x19' < auVar19[0xc]);
            auVar28[0xd] = auVar16[0xd] + ('\x19' < auVar19[0xd]);
            auVar28[0xe] = auVar16[0xe] + ('\x19' < auVar19[0xe]);
            auVar28[0xf] = auVar16[0xf] + ('\x19' < auVar19[0xf]);
            auVar16 = pshufb(auVar8,auVar28);
            puVar10[0x20] = auVar16[0] + auVar19[0];
            puVar10[0x21] = auVar16[1] + auVar19[1];
            puVar10[0x22] = auVar16[2] + auVar19[2];
            puVar10[0x23] = auVar16[3] + auVar19[3];
            puVar10[0x24] = auVar16[4] + auVar19[4];
            puVar10[0x25] = auVar16[5] + auVar19[5];
            puVar10[0x26] = auVar16[6] + auVar19[6];
            puVar10[0x27] = auVar16[7] + auVar19[7];
            puVar10[0x28] = auVar16[8] + auVar19[8];
            puVar10[0x29] = auVar16[9] + auVar19[9];
            puVar10[0x2a] = auVar16[10] + auVar19[10];
            puVar10[0x2b] = auVar16[0xb] + auVar19[0xb];
            puVar10[0x2c] = auVar16[0xc] + auVar19[0xc];
            puVar10[0x2d] = auVar16[0xd] + auVar19[0xd];
            puVar10[0x2e] = auVar16[0xe] + auVar19[0xe];
            puVar10[0x2f] = auVar16[0xf] + auVar19[0xf];
            auVar16 = pshufb(*(undefined1 (*) [16])(pauVar12[2] + 4),auVar3);
            auVar25 = pmulhuw(auVar16 & auVar4,auVar5);
            auVar16 = auVar16 & auVar6;
            auVar20._0_2_ = auVar16._0_2_ * 0x10;
            auVar20._2_2_ = auVar16._2_2_ * 0x100;
            auVar20._4_2_ = auVar16._4_2_ * 0x10;
            auVar20._6_2_ = auVar16._6_2_ * 0x100;
            auVar20._8_2_ = auVar16._8_2_ * 0x10;
            auVar20._10_2_ = auVar16._10_2_ * 0x100;
            auVar20._12_2_ = auVar16._12_2_ * 0x10;
            auVar20._14_2_ = auVar16._14_2_ * 0x100;
            auVar20 = auVar20 | auVar25;
            auVar16 = psubusb(auVar20,auVar7);
            auVar29[0] = auVar16[0] + ('\x19' < auVar20[0]);
            auVar29[1] = auVar16[1] + ('\x19' < auVar20[1]);
            auVar29[2] = auVar16[2] + ('\x19' < auVar20[2]);
            auVar29[3] = auVar16[3] + ('\x19' < auVar20[3]);
            auVar29[4] = auVar16[4] + ('\x19' < auVar20[4]);
            auVar29[5] = auVar16[5] + ('\x19' < auVar20[5]);
            auVar29[6] = auVar16[6] + ('\x19' < auVar20[6]);
            auVar29[7] = auVar16[7] + ('\x19' < auVar20[7]);
            auVar29[8] = auVar16[8] + ('\x19' < auVar20[8]);
            auVar29[9] = auVar16[9] + ('\x19' < auVar20[9]);
            auVar29[10] = auVar16[10] + ('\x19' < auVar20[10]);
            auVar29[0xb] = auVar16[0xb] + ('\x19' < auVar20[0xb]);
            auVar29[0xc] = auVar16[0xc] + ('\x19' < auVar20[0xc]);
            auVar29[0xd] = auVar16[0xd] + ('\x19' < auVar20[0xd]);
            auVar29[0xe] = auVar16[0xe] + ('\x19' < auVar20[0xe]);
            auVar29[0xf] = auVar16[0xf] + ('\x19' < auVar20[0xf]);
            auVar16 = pshufb(auVar8,auVar29);
            puVar10[0x30] = auVar16[0] + auVar20[0];
            puVar10[0x31] = auVar16[1] + auVar20[1];
            puVar10[0x32] = auVar16[2] + auVar20[2];
            puVar10[0x33] = auVar16[3] + auVar20[3];
            puVar10[0x34] = auVar16[4] + auVar20[4];
            puVar10[0x35] = auVar16[5] + auVar20[5];
            puVar10[0x36] = auVar16[6] + auVar20[6];
            puVar10[0x37] = auVar16[7] + auVar20[7];
            puVar10[0x38] = auVar16[8] + auVar20[8];
            puVar10[0x39] = auVar16[9] + auVar20[9];
            puVar10[0x3a] = auVar16[10] + auVar20[10];
            puVar10[0x3b] = auVar16[0xb] + auVar20[0xb];
            puVar10[0x3c] = auVar16[0xc] + auVar20[0xc];
            puVar10[0x3d] = auVar16[0xd] + auVar20[0xd];
            puVar10[0x3e] = auVar16[0xe] + auVar20[0xe];
            puVar10[0x3f] = auVar16[0xf] + auVar20[0xf];
            pauVar12 = pauVar12 + 3;
            puVar10 = puVar10 + 0x40;
            lVar15 = -8;
LAB_00103b67:
            auVar16 = pshufb(*pauVar12,auVar3);
            auVar25 = pmulhuw(auVar16 & auVar4,auVar5);
            auVar16 = auVar16 & auVar6;
            auVar21._0_2_ = auVar16._0_2_ * 0x10;
            auVar21._2_2_ = auVar16._2_2_ * 0x100;
            auVar21._4_2_ = auVar16._4_2_ * 0x10;
            auVar21._6_2_ = auVar16._6_2_ * 0x100;
            auVar21._8_2_ = auVar16._8_2_ * 0x10;
            auVar21._10_2_ = auVar16._10_2_ * 0x100;
            auVar21._12_2_ = auVar16._12_2_ * 0x10;
            auVar21._14_2_ = auVar16._14_2_ * 0x100;
            auVar21 = auVar21 | auVar25;
            auVar16 = psubusb(auVar21,auVar7);
            auVar30[0] = auVar16[0] + ('\x19' < auVar21[0]);
            auVar30[1] = auVar16[1] + ('\x19' < auVar21[1]);
            auVar30[2] = auVar16[2] + ('\x19' < auVar21[2]);
            auVar30[3] = auVar16[3] + ('\x19' < auVar21[3]);
            auVar30[4] = auVar16[4] + ('\x19' < auVar21[4]);
            auVar30[5] = auVar16[5] + ('\x19' < auVar21[5]);
            auVar30[6] = auVar16[6] + ('\x19' < auVar21[6]);
            auVar30[7] = auVar16[7] + ('\x19' < auVar21[7]);
            auVar30[8] = auVar16[8] + ('\x19' < auVar21[8]);
            auVar30[9] = auVar16[9] + ('\x19' < auVar21[9]);
            auVar30[10] = auVar16[10] + ('\x19' < auVar21[10]);
            auVar30[0xb] = auVar16[0xb] + ('\x19' < auVar21[0xb]);
            auVar30[0xc] = auVar16[0xc] + ('\x19' < auVar21[0xc]);
            auVar30[0xd] = auVar16[0xd] + ('\x19' < auVar21[0xd]);
            auVar30[0xe] = auVar16[0xe] + ('\x19' < auVar21[0xe]);
            auVar30[0xf] = auVar16[0xf] + ('\x19' < auVar21[0xf]);
            auVar16 = pshufb(auVar8,auVar30);
            *puVar10 = auVar16[0] + auVar21[0];
            puVar10[1] = auVar16[1] + auVar21[1];
            puVar10[2] = auVar16[2] + auVar21[2];
            puVar10[3] = auVar16[3] + auVar21[3];
            puVar10[4] = auVar16[4] + auVar21[4];
            puVar10[5] = auVar16[5] + auVar21[5];
            puVar10[6] = auVar16[6] + auVar21[6];
            puVar10[7] = auVar16[7] + auVar21[7];
            puVar10[8] = auVar16[8] + auVar21[8];
            puVar10[9] = auVar16[9] + auVar21[9];
            puVar10[10] = auVar16[10] + auVar21[10];
            puVar10[0xb] = auVar16[0xb] + auVar21[0xb];
            puVar10[0xc] = auVar16[0xc] + auVar21[0xc];
            puVar10[0xd] = auVar16[0xd] + auVar21[0xd];
            puVar10[0xe] = auVar16[0xe] + auVar21[0xe];
            puVar10[0xf] = auVar16[0xf] + auVar21[0xf];
            auVar16 = pshufb(*(undefined1 (*) [16])(*pauVar12 + 0xc),auVar3);
            auVar25 = pmulhuw(auVar16 & auVar4,auVar5);
            auVar16 = auVar16 & auVar6;
            auVar22._0_2_ = auVar16._0_2_ * 0x10;
            auVar22._2_2_ = auVar16._2_2_ * 0x100;
            auVar22._4_2_ = auVar16._4_2_ * 0x10;
            auVar22._6_2_ = auVar16._6_2_ * 0x100;
            auVar22._8_2_ = auVar16._8_2_ * 0x10;
            auVar22._10_2_ = auVar16._10_2_ * 0x100;
            auVar22._12_2_ = auVar16._12_2_ * 0x10;
            auVar22._14_2_ = auVar16._14_2_ * 0x100;
            auVar22 = auVar22 | auVar25;
            auVar16 = psubusb(auVar22,auVar7);
            auVar31[0] = auVar16[0] + ('\x19' < auVar22[0]);
            auVar31[1] = auVar16[1] + ('\x19' < auVar22[1]);
            auVar31[2] = auVar16[2] + ('\x19' < auVar22[2]);
            auVar31[3] = auVar16[3] + ('\x19' < auVar22[3]);
            auVar31[4] = auVar16[4] + ('\x19' < auVar22[4]);
            auVar31[5] = auVar16[5] + ('\x19' < auVar22[5]);
            auVar31[6] = auVar16[6] + ('\x19' < auVar22[6]);
            auVar31[7] = auVar16[7] + ('\x19' < auVar22[7]);
            auVar31[8] = auVar16[8] + ('\x19' < auVar22[8]);
            auVar31[9] = auVar16[9] + ('\x19' < auVar22[9]);
            auVar31[10] = auVar16[10] + ('\x19' < auVar22[10]);
            auVar31[0xb] = auVar16[0xb] + ('\x19' < auVar22[0xb]);
            auVar31[0xc] = auVar16[0xc] + ('\x19' < auVar22[0xc]);
            auVar31[0xd] = auVar16[0xd] + ('\x19' < auVar22[0xd]);
            auVar31[0xe] = auVar16[0xe] + ('\x19' < auVar22[0xe]);
            auVar31[0xf] = auVar16[0xf] + ('\x19' < auVar22[0xf]);
            auVar16 = pshufb(auVar8,auVar31);
            puVar10[0x10] = auVar16[0] + auVar22[0];
            puVar10[0x11] = auVar16[1] + auVar22[1];
            puVar10[0x12] = auVar16[2] + auVar22[2];
            puVar10[0x13] = auVar16[3] + auVar22[3];
            puVar10[0x14] = auVar16[4] + auVar22[4];
            puVar10[0x15] = auVar16[5] + auVar22[5];
            puVar10[0x16] = auVar16[6] + auVar22[6];
            puVar10[0x17] = auVar16[7] + auVar22[7];
            puVar10[0x18] = auVar16[8] + auVar22[8];
            puVar10[0x19] = auVar16[9] + auVar22[9];
            puVar10[0x1a] = auVar16[10] + auVar22[10];
            puVar10[0x1b] = auVar16[0xb] + auVar22[0xb];
            puVar10[0x1c] = auVar16[0xc] + auVar22[0xc];
            puVar10[0x1d] = auVar16[0xd] + auVar22[0xd];
            puVar10[0x1e] = auVar16[0xe] + auVar22[0xe];
            puVar10[0x1f] = auVar16[0xf] + auVar22[0xf];
            auVar16 = pshufb(*(undefined1 (*) [16])(pauVar12[1] + 8),auVar3);
            auVar25 = pmulhuw(auVar16 & auVar4,auVar5);
            auVar16 = auVar16 & auVar6;
            auVar23._0_2_ = auVar16._0_2_ * 0x10;
            auVar23._2_2_ = auVar16._2_2_ * 0x100;
            auVar23._4_2_ = auVar16._4_2_ * 0x10;
            auVar23._6_2_ = auVar16._6_2_ * 0x100;
            auVar23._8_2_ = auVar16._8_2_ * 0x10;
            auVar23._10_2_ = auVar16._10_2_ * 0x100;
            auVar23._12_2_ = auVar16._12_2_ * 0x10;
            auVar23._14_2_ = auVar16._14_2_ * 0x100;
            auVar23 = auVar23 | auVar25;
            auVar16 = psubusb(auVar23,auVar7);
            auVar32[0] = auVar16[0] + ('\x19' < auVar23[0]);
            auVar32[1] = auVar16[1] + ('\x19' < auVar23[1]);
            auVar32[2] = auVar16[2] + ('\x19' < auVar23[2]);
            auVar32[3] = auVar16[3] + ('\x19' < auVar23[3]);
            auVar32[4] = auVar16[4] + ('\x19' < auVar23[4]);
            auVar32[5] = auVar16[5] + ('\x19' < auVar23[5]);
            auVar32[6] = auVar16[6] + ('\x19' < auVar23[6]);
            auVar32[7] = auVar16[7] + ('\x19' < auVar23[7]);
            auVar32[8] = auVar16[8] + ('\x19' < auVar23[8]);
            auVar32[9] = auVar16[9] + ('\x19' < auVar23[9]);
            auVar32[10] = auVar16[10] + ('\x19' < auVar23[10]);
            auVar32[0xb] = auVar16[0xb] + ('\x19' < auVar23[0xb]);
            auVar32[0xc] = auVar16[0xc] + ('\x19' < auVar23[0xc]);
            auVar32[0xd] = auVar16[0xd] + ('\x19' < auVar23[0xd]);
            auVar32[0xe] = auVar16[0xe] + ('\x19' < auVar23[0xe]);
            auVar32[0xf] = auVar16[0xf] + ('\x19' < auVar23[0xf]);
            auVar16 = pshufb(auVar8,auVar32);
            puVar10[0x20] = auVar16[0] + auVar23[0];
            puVar10[0x21] = auVar16[1] + auVar23[1];
            puVar10[0x22] = auVar16[2] + auVar23[2];
            puVar10[0x23] = auVar16[3] + auVar23[3];
            puVar10[0x24] = auVar16[4] + auVar23[4];
            puVar10[0x25] = auVar16[5] + auVar23[5];
            puVar10[0x26] = auVar16[6] + auVar23[6];
            puVar10[0x27] = auVar16[7] + auVar23[7];
            puVar10[0x28] = auVar16[8] + auVar23[8];
            puVar10[0x29] = auVar16[9] + auVar23[9];
            puVar10[0x2a] = auVar16[10] + auVar23[10];
            puVar10[0x2b] = auVar16[0xb] + auVar23[0xb];
            puVar10[0x2c] = auVar16[0xc] + auVar23[0xc];
            puVar10[0x2d] = auVar16[0xd] + auVar23[0xd];
            puVar10[0x2e] = auVar16[0xe] + auVar23[0xe];
            puVar10[0x2f] = auVar16[0xf] + auVar23[0xf];
            src = pauVar12[2] + 4;
            out = (char *)(puVar10 + 0x30);
          }
          auVar16 = pshufb(*(undefined1 (*) [16])src,auVar3);
          auVar25 = pmulhuw(auVar16 & auVar4,auVar5);
          auVar16 = auVar16 & auVar6;
          auVar24._0_2_ = auVar16._0_2_ * 0x10;
          auVar24._2_2_ = auVar16._2_2_ * 0x100;
          auVar24._4_2_ = auVar16._4_2_ * 0x10;
          auVar24._6_2_ = auVar16._6_2_ * 0x100;
          auVar24._8_2_ = auVar16._8_2_ * 0x10;
          auVar24._10_2_ = auVar16._10_2_ * 0x100;
          auVar24._12_2_ = auVar16._12_2_ * 0x10;
          auVar24._14_2_ = auVar16._14_2_ * 0x100;
          auVar24 = auVar24 | auVar25;
          auVar16 = psubusb(auVar24,auVar7);
          auVar34[0] = auVar16[0] + ('\x19' < auVar24[0]);
          auVar34[1] = auVar16[1] + ('\x19' < auVar24[1]);
          auVar34[2] = auVar16[2] + ('\x19' < auVar24[2]);
          auVar34[3] = auVar16[3] + ('\x19' < auVar24[3]);
          auVar34[4] = auVar16[4] + ('\x19' < auVar24[4]);
          auVar34[5] = auVar16[5] + ('\x19' < auVar24[5]);
          auVar34[6] = auVar16[6] + ('\x19' < auVar24[6]);
          auVar34[7] = auVar16[7] + ('\x19' < auVar24[7]);
          auVar34[8] = auVar16[8] + ('\x19' < auVar24[8]);
          auVar34[9] = auVar16[9] + ('\x19' < auVar24[9]);
          auVar34[10] = auVar16[10] + ('\x19' < auVar24[10]);
          auVar34[0xb] = auVar16[0xb] + ('\x19' < auVar24[0xb]);
          auVar34[0xc] = auVar16[0xc] + ('\x19' < auVar24[0xc]);
          auVar34[0xd] = auVar16[0xd] + ('\x19' < auVar24[0xd]);
          auVar34[0xe] = auVar16[0xe] + ('\x19' < auVar24[0xe]);
          auVar34[0xf] = auVar16[0xf] + ('\x19' < auVar24[0xf]);
          auVar16 = pshufb(auVar8,auVar34);
          *out = auVar16[0] + auVar24[0];
          ((uint8_t *)out)[1] = auVar16[1] + auVar24[1];
          ((uint8_t *)out)[2] = auVar16[2] + auVar24[2];
          ((uint8_t *)out)[3] = auVar16[3] + auVar24[3];
          ((uint8_t *)out)[4] = auVar16[4] + auVar24[4];
          ((uint8_t *)out)[5] = auVar16[5] + auVar24[5];
          ((uint8_t *)out)[6] = auVar16[6] + auVar24[6];
          ((uint8_t *)out)[7] = auVar16[7] + auVar24[7];
          ((uint8_t *)out)[8] = auVar16[8] + auVar24[8];
          ((uint8_t *)out)[9] = auVar16[9] + auVar24[9];
          ((uint8_t *)out)[10] = auVar16[10] + auVar24[10];
          ((uint8_t *)out)[0xb] = auVar16[0xb] + auVar24[0xb];
          ((uint8_t *)out)[0xc] = auVar16[0xc] + auVar24[0xc];
          ((uint8_t *)out)[0xd] = auVar16[0xd] + auVar24[0xd];
          ((uint8_t *)out)[0xe] = auVar16[0xe] + auVar24[0xe];
          ((uint8_t *)out)[0xf] = auVar16[0xf] + auVar24[0xf];
          src = *(undefined1 (*) [16])src + 0xc;
          out = (char *)((uint8_t *)out + 0x10);
          uVar11 = uVar11 + lVar15;
          puVar10 = (uint8_t *)out;
          pauVar12 = (undefined1 (*) [16])src;
        } while (uVar11 != 0);
      }
      if (srclen == 0) {
        uVar14 = 0;
        break;
      }
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(*(undefined1 (*) [16])src)[0] >> 2];
      out = (char *)((uint8_t *)out + 1);
      puVar2 = *(undefined1 (*) [16])src;
      src = *(undefined1 (*) [16])src + 1;
      bVar13 = (*puVar2 & 3) << 4;
      sVar9 = sVar9 + 1;
LAB_00103d95:
      if (srclen == 0) {
        uVar14 = 1;
        break;
      }
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar13 | (byte)*src >> 4)];
      out = (char *)((uint8_t *)out + 1);
      bVar13 = *src;
      src = (char *)((byte *)src + 1);
      bVar13 = (bVar13 & 0xf) << 2;
      sVar9 = sVar9 + 1;
LAB_00103dcf:
      if (srclen == 0) goto LAB_00103e14;
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar13 | (byte)*src >> 6)];
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      ((uint8_t *)out)[1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
      out = (char *)((uint8_t *)out + 2);
      uVar11 = sVar9 + 2;
    } while( true );
  }
LAB_00103e27:
  state->bytes = uVar14;
  state->carry = bVar13;
  *outlen = sVar9;
  return;
LAB_00103e14:
  uVar14 = 2;
  goto LAB_00103e27;
}

Assistant:

BASE64_ENC_FUNCTION(ssse3)
{
#if HAVE_SSSE3
	#include "../generic/enc_head.c"
	enc_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}